

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O3

void __thiscall gutil::Parameter::addParamDef(Parameter *this,char **pdef)

{
  char **ppcVar1;
  char *pcVar2;
  string s;
  undefined1 local_70 [32];
  string local_50;
  
  pcVar2 = *pdef;
  if (pcVar2 != (char *)0x0) {
    ppcVar1 = pdef + 1;
    do {
      std::__cxx11::string::string((string *)local_70,pcVar2,(allocator *)&local_50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->def,(value_type *)local_70);
      anon_unknown_4::getValue(&local_50,(anon_unknown_4 *)local_70._0_8_,(string *)local_70._8_8_);
      std::__cxx11::string::operator=((string *)local_70,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (((string *)local_70._8_8_ != (string *)0x0) &&
         (*(anon_unknown_4 *)local_70._0_8_ == (anon_unknown_4)0x2d)) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->allparam,(value_type *)local_70);
      }
      if ((anon_unknown_4 *)local_70._0_8_ != (anon_unknown_4 *)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_);
      }
      pcVar2 = *ppcVar1;
      ppcVar1 = ppcVar1 + 1;
    } while (pcVar2 != (char *)0x0);
  }
  return;
}

Assistant:

void Parameter::addParamDef(const char *pdef[])
{
  for (int i=0; pdef[i] != 0; i++)
  {
    std::string s=pdef[i];
    def.push_back(s);

    s=getValue(s);

    if (s.size() > 0 && s[0] == '-')
    {
      allparam.insert(s);
    }
  }
}